

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void op_addr_rr_post(DisasContext_conflict1 *s,arg_ldst_rr *a,TCGv_i32 addr,int address_offset)

{
  TCGContext_conflict1 *tcg_ctx_00;
  TCGv_i32 var;
  TCGv_i32 ofs;
  TCGContext_conflict1 *tcg_ctx;
  int address_offset_local;
  TCGv_i32 addr_local;
  arg_ldst_rr *a_local;
  DisasContext_conflict1 *s_local;
  
  tcg_ctx_00 = s->uc->tcg_ctx;
  if (a->p == 0) {
    var = load_reg(s,a->rm);
    gen_arm_shift_im(tcg_ctx_00,var,a->shtype,a->shimm,0);
    if (a->u == 0) {
      tcg_gen_sub_i32(tcg_ctx_00,addr,addr,var);
    }
    else {
      tcg_gen_add_i32(tcg_ctx_00,addr,addr,var);
    }
    tcg_temp_free_i32(tcg_ctx_00,var);
  }
  else if (a->w == 0) {
    tcg_temp_free_i32(tcg_ctx_00,addr);
    return;
  }
  tcg_gen_addi_i32_aarch64(tcg_ctx_00,addr,addr,address_offset);
  store_reg(s,a->rn,addr);
  return;
}

Assistant:

static void op_addr_rr_post(DisasContext *s, arg_ldst_rr *a,
                            TCGv_i32 addr, int address_offset)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    if (!a->p) {
        TCGv_i32 ofs = load_reg(s, a->rm);
        gen_arm_shift_im(tcg_ctx, ofs, a->shtype, a->shimm, 0);
        if (a->u) {
            tcg_gen_add_i32(tcg_ctx, addr, addr, ofs);
        } else {
            tcg_gen_sub_i32(tcg_ctx, addr, addr, ofs);
        }
        tcg_temp_free_i32(tcg_ctx, ofs);
    } else if (!a->w) {
        tcg_temp_free_i32(tcg_ctx, addr);
        return;
    }
    tcg_gen_addi_i32(tcg_ctx, addr, addr, address_offset);
    store_reg(s, a->rn, addr);
}